

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::InvocationInterlockPlacementPass::placeInstructionsForEdge
          (InvocationInterlockPlacementPass *this,BasicBlock *block,uint32_t next_id,
          BlockSet *inside,BlockSet *previous_inside,Op opcode,bool reverse_cfg)

{
  Instruction *pIVar1;
  IRContext *this_00;
  Instruction *pIVar2;
  Instruction *pIVar3;
  bool bVar4;
  uint32_t uVar5;
  const_iterator cVar6;
  long *plVar7;
  BasicBlock *pBVar8;
  Instruction *this_01;
  bool next_has_previous_inside;
  __alloc_node_gen_t __alloc_node_gen;
  char local_a9;
  uint32_t local_a8;
  uint local_a4;
  Op local_a0;
  uint32_t local_9c;
  _AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,_false>_>_> local_98;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  char *local_70;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_a8 = next_id;
  cVar6 = std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&previous_inside->_M_h,&local_a8);
  if (cVar6.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
    bVar4 = false;
  }
  else {
    pIVar1 = (block->label_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    uVar5 = 0;
    if (pIVar1->has_result_id_ == true) {
      uVar5 = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
    }
    local_70 = (char *)CONCAT44(local_70._4_4_,uVar5);
    cVar6 = std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&inside->_M_h,(key_type_conflict *)&local_70);
    bVar4 = false;
    uVar5 = 0;
    if (cVar6.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
      pIVar1 = (block->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      if (pIVar1->has_result_id_ == true) {
        uVar5 = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
      }
      bVar4 = hasSingleNextBlock(this,uVar5,reverse_cfg);
      if (bVar4) {
        local_70 = &local_a9;
        local_a9 = '\0';
        local_9c = local_a8;
        local_68._M_buckets = (__buckets_ptr)0x0;
        local_68._M_bucket_count = (inside->_M_h)._M_bucket_count;
        local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_68._M_element_count = (inside->_M_h)._M_element_count;
        local_68._M_rehash_policy._M_max_load_factor =
             (inside->_M_h)._M_rehash_policy._M_max_load_factor;
        local_68._M_rehash_policy._4_4_ = *(undefined4 *)&(inside->_M_h)._M_rehash_policy.field_0x4;
        local_68._M_rehash_policy._M_next_resize = (inside->_M_h)._M_rehash_policy._M_next_resize;
        local_68._M_single_bucket = (__node_base_ptr)0x0;
        local_a4 = (uint)reverse_cfg;
        local_a0 = opcode;
        local_98._M_h = (__hashtable_alloc *)&local_68;
        std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_assign<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&local_68,&inside->_M_h,&local_98);
        local_90._8_8_ = 0;
        plVar7 = (long *)operator_new(0x40);
        *plVar7 = (long)local_70;
        std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)(plVar7 + 1),&local_68,&local_68);
        local_78 = std::
                   _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:355:19)>
                   ::_M_invoke;
        local_80 = std::
                   _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:355:19)>
                   ::_M_manager;
        local_90._M_unused._M_object = plVar7;
        forEachNext(this,local_9c,!reverse_cfg,(function<void_(unsigned_int)> *)&local_90);
        if (local_80 != (code *)0x0) {
          (*local_80)(&local_90,&local_90,__destroy_functor);
        }
        std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&local_68);
        if (local_a9 == '\0') {
          __assert_fail("next_has_previous_inside && \"`previous_inside` must be the set of blocks with at least one \" \"previous block in `inside`\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp"
                        ,0x16a,
                        "bool spvtools::opt::InvocationInterlockPlacementPass::placeInstructionsForEdge(BasicBlock *, uint32_t, BlockSet &, BlockSet &, spv::Op, bool)"
                       );
        }
        addInstructionAtBlockBoundary(this,block,local_a0,SUB41(local_a4,0));
      }
      else {
        uVar5 = local_a8;
        if (!reverse_cfg) {
          this_00 = (this->super_Pass).context_;
          if ((this_00->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
            IRContext::BuildCFG(this_00);
          }
          pBVar8 = CFG::block((this_00->cfg_)._M_t.
                              super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                              .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl,
                              local_a8);
          pIVar1 = (block->label_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                   .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
          block = pBVar8;
          uVar5 = 0;
          if (pIVar1->has_result_id_ == true) {
            uVar5 = Instruction::GetSingleWordOperand(pIVar1,(uint)pIVar1->has_type_id_);
          }
        }
        pBVar8 = splitEdge(this,block,uVar5);
        this_01 = (Instruction *)operator_new(0x70);
        Instruction::Instruction(this_01,(this->super_Pass).context_,opcode);
        pIVar1 = (pBVar8->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
        if ((pIVar1 == (Instruction *)0x0) ||
           ((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
          __assert_fail("!insts_.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h"
                        ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
        }
        if ((this_01->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == true) {
          __assert_fail("!this->is_sentinel_ && \"Sentinel nodes cannot be moved around.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/ilist_node.h"
                        ,0xae,
                        "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore(NodeType *) [NodeType = spvtools::opt::Instruction]"
                       );
        }
        pIVar1 = (pBVar8->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
        if ((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ ==
            (Instruction *)0x0) {
          __assert_fail("pos->IsInAList() && \"Pos should already be in a list.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/ilist_node.h"
                        ,0xaf,
                        "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore(NodeType *) [NodeType = spvtools::opt::Instruction]"
                       );
        }
        pIVar2 = (this_01->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        if (pIVar2 != (Instruction *)0x0) {
          pIVar3 = (this_01->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
          (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = pIVar3;
          (pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar2;
          (this_01->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
               (Instruction *)0x0;
        }
        (this_01->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar1;
        (this_01->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
             (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
        (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = this_01;
        (((this_01->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_)->
        super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = this_01;
      }
      bVar4 = true;
    }
  }
  return bVar4;
}

Assistant:

bool InvocationInterlockPlacementPass::placeInstructionsForEdge(
    BasicBlock* block, uint32_t next_id, BlockSet& inside,
    BlockSet& previous_inside, spv::Op opcode, bool reverse_cfg) {
  bool modified = false;

  if (previous_inside.count(next_id) && !inside.count(block->id())) {
    // This block is not in the critical section but the next has at least one
    // other previous block that is, so this block should be enter it as well.
    // We need to add begin or end instructions to the edge.

    modified = true;

    if (hasSingleNextBlock(block->id(), reverse_cfg)) {
      // This is the only next block.

      // Additionally, because `next_id` is in `previous_inside`, we know that
      // `next_id` has at least one previous block in `inside`. And because
      // 'block` is not in `inside`, that means the `next_id` has to have at
      // least one other previous block in `inside`.

      // This is solely for a debug assertion. It is essentially recomputing the
      // value of `previous_inside` to verify that it was computed correctly
      // such that the above statement is true.
      bool next_has_previous_inside = false;
      // By passing !reverse_cfg to forEachNext, we are actually iterating over
      // the previous blocks.
      forEachNext(next_id, !reverse_cfg,
                  [&next_has_previous_inside, inside](uint32_t previous_id) {
                    if (inside.count(previous_id)) {
                      next_has_previous_inside = true;
                    }
                  });
      assert(next_has_previous_inside &&
             "`previous_inside` must be the set of blocks with at least one "
             "previous block in `inside`");

      addInstructionAtBlockBoundary(block, opcode, reverse_cfg);
    } else {
      // This block has multiple next blocks. Split the edge and insert the
      // instruction in the new next block.
      BasicBlock* new_branch;
      if (reverse_cfg) {
        new_branch = splitEdge(block, next_id);
      } else {
        new_branch = splitEdge(cfg()->block(next_id), block->id());
      }

      auto inst = new Instruction(context(), opcode);
      inst->InsertBefore(&*new_branch->tail());
    }
  }

  return modified;
}